

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::__cxx11::string,std::__cxx11::string,char[2]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [2])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  size_t local_58;
  char *pcStack_50;
  size_type local_48;
  pointer local_40;
  size_type local_38;
  pointer local_30;
  size_t local_28;
  char (*local_20) [2];
  
  local_68._M_len = (a->View_)._M_len;
  local_68._M_str = (a->View_)._M_str;
  local_58 = (b->View_)._M_len;
  pcStack_50 = (b->View_)._M_str;
  local_40 = (args->_M_dataplus)._M_p;
  local_48 = args->_M_string_length;
  local_30 = (args_1->_M_dataplus)._M_p;
  local_38 = args_1->_M_string_length;
  local_28 = strlen(*args_2);
  views._M_len = 5;
  views._M_array = &local_68;
  local_20 = args_2;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}